

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O1

Aig_Man_t * Aig_ManStartFrom(Aig_Man_t *p)

{
  char *pcVar1;
  void *pvVar2;
  Aig_Man_t *p_00;
  size_t sVar3;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  Aig_Obj_t *pAVar6;
  long lVar7;
  
  p_00 = Aig_ManStart(p->vObjs->nSize);
  pcVar1 = p->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar1);
    pcVar4 = (char *)malloc(sVar3 + 1);
    strcpy(pcVar4,pcVar1);
  }
  p_00->pName = pcVar4;
  pcVar1 = p->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    sVar3 = strlen(pcVar1);
    pcVar4 = (char *)malloc(sVar3 + 1);
    strcpy(pcVar4,pcVar1);
  }
  p_00->pSpec = pcVar4;
  p->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p_00->pConst1;
  pVVar5 = p->vCis;
  if (0 < pVVar5->nSize) {
    lVar7 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar7];
      pAVar6 = Aig_ObjCreateCi(p_00);
      *(ulong *)&pAVar6->field_0x18 =
           *(ulong *)&pAVar6->field_0x18 & 0xff000000ffffffff |
           *(ulong *)((long)pvVar2 + 0x18) & 0xffffff00000000;
      *(Aig_Obj_t **)((long)pvVar2 + 0x28) = pAVar6;
      lVar7 = lVar7 + 1;
      pVVar5 = p->vCis;
    } while (lVar7 < pVVar5->nSize);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManStartFrom( Aig_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew;
    int i;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
    {
        pObjNew = Aig_ObjCreateCi( pNew );
        pObjNew->Level = pObj->Level;
        pObj->pData = pObjNew;
    }
    return pNew;
}